

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O3

void __thiscall CProficiencies::ListKnownProficiencies(CProficiencies *this,char_data *player)

{
  PC_DATA *pPVar1;
  undefined *puVar2;
  pointer pcVar3;
  pointer pbVar4;
  undefined **ppuVar5;
  long lVar6;
  CProficiencies *this_00;
  ulong uVar7;
  pointer pbVar8;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  responseList;
  string profStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> response;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  value_type local_288;
  char *local_268 [2];
  undefined *local_258;
  buffer<char> local_248;
  char local_228 [504];
  
  if (player == (char_data *)0x0) {
    fmt_00._M_str = "CProficiencies::ListKnownProficiencies: Player is null.";
    fmt_00._M_len = 0x37;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt_00);
    return;
  }
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  uVar7 = 0;
  do {
    if (-1 < this->profs[uVar7]) {
      pPVar1 = this->ch->pcdata;
      ppuVar5 = (undefined **)
                ((long)&(prof_table.
                         super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                         _M_impl.super__Vector_impl_data._M_start)->ppsn + lVar6);
      if (((long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)prof_table.super__Vector_base<proficiency_type,_std::allocator<proficiency_type>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 - 1U < uVar7)
      {
        ppuVar5 = &PTR_psn_none_004a0e28;
      }
      if (pPVar1 == (PC_DATA *)0x0) {
        this_00 = &prof_none;
      }
      else {
        this_00 = &pPVar1->profs;
      }
      puVar2 = ppuVar5[1];
      local_268[0] = GetSkillLevelName(this_00,(int)uVar7);
      local_248.size_ = 0;
      local_248._vptr_buffer = (_func_int **)&PTR_grow_0044b3a0;
      local_248.capacity_ = 500;
      fmt.size_ = 0x13;
      fmt.data_ = "You are {} at {}.\n\r";
      args.field_1.values_ =
           (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_268;
      args.desc_ = 0xcc;
      local_258 = puVar2;
      local_248.ptr_ = local_228;
      ::fmt::v9::detail::vformat_to<char>(&local_248,fmt,args,(locale_ref)0x0);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,local_248.ptr_,local_248.ptr_ + local_248.size_);
      if (local_248.ptr_ != local_228) {
        operator_delete(local_248.ptr_,local_248.capacity_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,&local_288);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x28;
  } while (uVar7 != 0x19);
  if (local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    send_to_char("You currently have no proficiencies.\n\r",player);
  }
  else {
    send_to_char("Your proficiencies are:\n\r",player);
    pbVar4 = local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = (pbVar8->_M_dataplus)._M_p;
        local_248._vptr_buffer = (_func_int **)&local_248.size_;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pcVar3,pcVar3 + pbVar8->_M_string_length);
        send_to_char((char *)local_248._vptr_buffer,player);
        if (local_248._vptr_buffer != (_func_int **)&local_248.size_) {
          operator_delete(local_248._vptr_buffer,local_248.size_ + 1);
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar4);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  return;
}

Assistant:

void CProficiencies::ListKnownProficiencies(char_data* player)
{
	if (player == nullptr)
	{
		RS.Logger.Debug("CProficiencies::ListKnownProficiencies: Player is null.");
		return;
	}

	std::vector<std::string> responseList;

	auto limit = std::size(profs);
	for (int i = 0; i < limit ; i++)
	{
		if(profs[i] < 0)
			continue;
		
		char* profName = ch->Profs()->GetProficiency(i).name;
		auto profStr = fmt::format("You are {} at {}.\n\r", ch->Profs()->GetSkillLevelName(i), profName);
		responseList.push_back(profStr);
	}

	if (responseList.empty())
	{
		send_to_char("You currently have no proficiencies.\n\r", player);
	}
	else
	{
		send_to_char("Your proficiencies are:\n\r", player);
		for (auto response : responseList)
		{
			send_to_char(response.c_str(), player);
		}
	}	
}